

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoop.cpp
# Opt level: O0

void __thiscall EventLoop::queueInLoop(EventLoop *this,Functor *cb)

{
  bool bVar1;
  MutexLockGuard local_20;
  MutexLockGuard lock;
  Functor *cb_local;
  EventLoop *this_local;
  
  lock.mutex = (MutexLock *)cb;
  MutexLockGuard::MutexLockGuard(&local_20,&this->mutex_);
  std::vector<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::push_back
            (&this->pendingFuntors_,cb);
  MutexLockGuard::~MutexLockGuard(&local_20);
  bVar1 = isInLoopThread(this);
  if ((!bVar1) || ((this->callingPendingFunctors_ & 1U) != 0)) {
    wakeup(this);
  }
  return;
}

Assistant:

void EventLoop::queueInLoop(Functor cb) {
    {
        MutexLockGuard lock(mutex_);
        pendingFuntors_.push_back(std::move(cb));
    }
    if(!isInLoopThread() || callingPendingFunctors_) {
        wakeup();
    }
}